

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O0

SinkCombineResultType __thiscall
duckdb::PhysicalBatchCopyToFile::Combine
          (PhysicalBatchCopyToFile *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  bool bVar1;
  FixedBatchCopyLocalState *pFVar2;
  FixedBatchCopyGlobalState *pFVar3;
  GlobalSinkState *in_RDI;
  BatchMemoryManager *unaff_retaddr;
  lock_guard<std::mutex> l;
  BatchMemoryManager *memory_manager;
  FixedBatchCopyGlobalState *gstate;
  FixedBatchCopyLocalState *state;
  ClientContext *in_stack_00000048;
  PhysicalBatchCopyToFile *in_stack_00000050;
  mutex_type *in_stack_ffffffffffffffb8;
  ClientContext *in_stack_ffffffffffffffc8;
  PhysicalBatchCopyToFile *this_00;
  GlobalSinkState *current_min_batch_index;
  
  current_min_batch_index = in_RDI;
  pFVar2 = LocalSinkState::Cast<duckdb::FixedBatchCopyLocalState>((LocalSinkState *)in_RDI);
  pFVar3 = GlobalSinkState::Cast<duckdb::FixedBatchCopyGlobalState>(in_RDI);
  this_00 = (PhysicalBatchCopyToFile *)&pFVar3->memory_manager;
  ::std::__atomic_base<unsigned_long>::operator+=
            (&(pFVar3->rows_copied).super___atomic_base<unsigned_long>,pFVar2->rows_copied);
  AddLocalBatch(in_stack_00000050,in_stack_00000048,(GlobalSinkState *)this,
                (LocalSinkState *)context);
  bVar1 = ::std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffffc8);
  if (!bVar1) {
    ::std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffb8);
    ::std::atomic<bool>::operator=
              ((atomic<bool> *)in_RDI,SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
    ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x185f344);
  }
  optional_idx::GetIndex((optional_idx *)unaff_retaddr);
  BatchMemoryManager::UpdateMinBatchIndex(unaff_retaddr,(idx_t)current_min_batch_index);
  ExecuteTasks(this_00,in_stack_ffffffffffffffc8,in_RDI);
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalBatchCopyToFile::Combine(ExecutionContext &context,
                                                       OperatorSinkCombineInput &input) const {
	auto &state = input.local_state.Cast<FixedBatchCopyLocalState>();
	auto &gstate = input.global_state.Cast<FixedBatchCopyGlobalState>();
	auto &memory_manager = gstate.memory_manager;
	gstate.rows_copied += state.rows_copied;

	// add any final remaining local batches
	AddLocalBatch(context.client, gstate, state);

	if (!gstate.any_finished) {
		// signal that this thread is finished processing batches and that we should move on to Finalize
		lock_guard<mutex> l(gstate.lock);
		gstate.any_finished = true;
	}
	memory_manager.UpdateMinBatchIndex(state.partition_info.min_batch_index.GetIndex());
	ExecuteTasks(context.client, gstate);

	return SinkCombineResultType::FINISHED;
}